

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsPipeline.cpp
# Opt level: O2

Ptr<GraphicsPipeline> __thiscall
myvk::GraphicsPipeline::Create
          (GraphicsPipeline *this,Ptr<PipelineLayout> *pipeline_layout,Ptr<RenderPass> *render_pass,
          vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          *shader_stages,GraphicsPipelineState *pipeline_state,uint32_t subpass)

{
  VkDevice pVVar1;
  PFN_vkCreateGraphicsPipelines p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int iVar4;
  VkResult VVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr<GraphicsPipeline> PVar6;
  shared_ptr<myvk::GraphicsPipeline> ret;
  VkGraphicsPipelineCreateInfo create_info;
  
  std::make_shared<myvk::GraphicsPipeline>();
  std::__shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((ret.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_PipelineBase).m_pipeline_layout_ptr.
              super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>,
             &pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::__shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((ret.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_render_pass_ptr).super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>,
             &render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>);
  memset(&create_info,0,0x90);
  create_info.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  create_info.renderPass =
       ((render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       m_render_pass;
  create_info.layout =
       ((pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->m_pipeline_layout;
  create_info.pStages =
       (shader_stages->
       super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
       )._M_impl.super__Vector_impl_data._M_start;
  create_info.stageCount =
       (uint32_t)
       (((long)(shader_stages->
               super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)create_info.pStages) / 0x30);
  GraphicsPipelineState::PopGraphicsPipelineCreateInfo(pipeline_state,&create_info);
  p_Var2 = vkCreateGraphicsPipelines;
  create_info.subpass = subpass;
  iVar4 = (*(((pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  pVVar1 = *(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar4) + 0x268);
  iVar4 = (*(((pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  VVar5 = (*p_Var2)(pVVar1,*(VkPipelineCache *)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x270),1,
                    &create_info,(VkAllocationCallbacks *)0x0,
                    &((ret.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_PipelineBase).m_pipeline);
  _Var3 = ret.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (VVar5 == VK_SUCCESS) {
    ret.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base._vptr_Base =
         (_func_int **)
         ret.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var3._M_pi;
    ret.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ret.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  PVar6.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar6.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<GraphicsPipeline>)
         PVar6.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<GraphicsPipeline> GraphicsPipeline::Create(const Ptr<PipelineLayout> &pipeline_layout,
                                               const Ptr<RenderPass> &render_pass,
                                               const std::vector<VkPipelineShaderStageCreateInfo> &shader_stages,
                                               const GraphicsPipelineState &pipeline_state, uint32_t subpass) {
	auto ret = std::make_shared<GraphicsPipeline>();
	ret->m_pipeline_layout_ptr = pipeline_layout;
	ret->m_render_pass_ptr = render_pass;

	VkGraphicsPipelineCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
	create_info.renderPass = render_pass->GetHandle();
	create_info.layout = pipeline_layout->GetHandle();
	create_info.stageCount = shader_stages.size();
	create_info.pStages = shader_stages.data();
	pipeline_state.PopGraphicsPipelineCreateInfo(&create_info);
	create_info.subpass = subpass;

	if (vkCreateGraphicsPipelines(pipeline_layout->GetDevicePtr()->GetHandle(),
	                              pipeline_layout->GetDevicePtr()->GetPipelineCacheHandle(), 1, &create_info, nullptr,
	                              &ret->m_pipeline) != VK_SUCCESS)
		return nullptr;
	return ret;
}